

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::anon_unknown_1::TestGroup::execute(TestGroup *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  iterator this_00;
  iterator testSpec;
  reference pbVar4;
  IStreamingReporter *pIVar5;
  long in_RSI;
  Totals *in_RDI;
  Totals *totals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *invalidArg;
  const_iterator __end3;
  const_iterator __begin3;
  vectorStrings *__range3;
  FilterMatch *match;
  iterator __end2_1;
  iterator __begin2_1;
  Matches *__range2_1;
  TestCase **testCase;
  iterator __end2;
  iterator __begin2;
  Tests *__range2;
  TestCase *in_stack_00000118;
  RunContext *in_stack_00000120;
  vectorStrings *invalidArgs;
  Totals *in_stack_fffffffffffffec8;
  RunContext *in_stack_fffffffffffffed0;
  Totals *this_01;
  string local_f8 [16];
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  RunContext *in_stack_ffffffffffffff30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  vectorStrings *local_c0;
  reference local_b8;
  FilterMatch *local_b0;
  __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
  local_a8;
  long local_a0;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Totals *in_stack_ffffffffffffffa0;
  string local_30 [32];
  vectorStrings *local_10;
  
  this_01 = in_RDI;
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x241d2b);
  iVar2 = (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  local_10 = TestSpec::getInvalidArgs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var,iVar2));
  Totals::Totals((Totals *)in_stack_fffffffffffffed0);
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x241d67);
  (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])();
  RunContext::testGroupStarting
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_30);
  this_00 = clara::std::
            set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
            ::begin((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
                     *)in_stack_fffffffffffffec8);
  testSpec = clara::std::
             set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
             ::end((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
                    *)in_stack_fffffffffffffec8);
  while (bVar1 = clara::std::operator!=
                           ((_Self *)&stack0xffffffffffffffb0,(_Self *)&stack0xffffffffffffffa8),
        bVar1) {
    in_stack_ffffffffffffffa0 =
         (Totals *)
         clara::std::_Rb_tree_const_iterator<const_Catch::TestCase_*>::operator*
                   ((_Rb_tree_const_iterator<const_Catch::TestCase_*> *)0x241e0e);
    bVar1 = RunContext::aborting(in_stack_fffffffffffffed0);
    if (bVar1) {
      pIVar5 = RunContext::reporter((RunContext *)0x241e91);
      (*pIVar5->_vptr_IStreamingReporter[0xf])(pIVar5,*(TestCase **)in_stack_ffffffffffffffa0);
    }
    else {
      RunContext::runTest(in_stack_00000120,in_stack_00000118);
      Totals::operator+=((Totals *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    clara::std::_Rb_tree_const_iterator<const_Catch::TestCase_*>::operator++
              ((_Rb_tree_const_iterator<const_Catch::TestCase_*> *)in_stack_fffffffffffffed0);
  }
  local_a0 = in_RSI + 0x230;
  local_a8._M_current =
       (FilterMatch *)
       clara::std::
       vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::begin
                 ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                   *)in_stack_fffffffffffffec8);
  local_b0 = (FilterMatch *)
             clara::std::
             vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
             end((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                             *)in_stack_fffffffffffffec8), bVar1) {
    local_b8 = __gnu_cxx::
               __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
               ::operator*(&local_a8);
    bVar1 = clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::
            empty((vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> *)
                  this_01);
    if (bVar1) {
      pIVar5 = RunContext::reporter((RunContext *)0x241f4b);
      (*pIVar5->_vptr_IStreamingReporter[3])(pIVar5,local_b8);
      in_RDI->error = -1;
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
    ::operator++(&local_a8);
  }
  bVar1 = clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01);
  if (!bVar1) {
    local_c0 = local_10;
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         clara::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffec8);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      pIVar5 = RunContext::reporter((RunContext *)0x241fe9);
      (*pIVar5->_vptr_IStreamingReporter[4])(pIVar5,pbVar4);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
  }
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x24201b);
  (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])();
  RunContext::testGroupEnded
            ((RunContext *)this_00._M_node,(string *)testSpec._M_node,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_f8);
  return this_01;
}

Assistant:

Totals execute() {
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();
                Totals totals;
                m_context.testGroupStarting(m_config->name(), 1, 1);
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_context.reporter().skipTest(*testCase);
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_context.reporter().noMatchingTestCases(match.name);
                        totals.error = -1;
                    }
                }

                if (!invalidArgs.empty()) {
                    for (auto const& invalidArg: invalidArgs)
                         m_context.reporter().reportInvalidArguments(invalidArg);
                }

                m_context.testGroupEnded(m_config->name(), totals, 1, 1);
                return totals;
            }